

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O0

Lifetime * __thiscall
SCCLiveness::InsertLifetime(SCCLiveness *this,StackSym *stackSym,RegNum reg,Instr *currentInstr)

{
  uint uVar1;
  Func *this_00;
  bool bVar2;
  uint uVar3;
  RegSlot slotIndex;
  JitArenaAllocator *pJVar4;
  Lifetime *this_01;
  Type *ppLVar5;
  Lifetime **lifetime;
  EditingIterator iter;
  TrackAllocData local_60;
  Lifetime *local_38;
  Lifetime *newLlifetime;
  uint end;
  uint start;
  Instr *currentInstr_local;
  StackSym *pSStack_18;
  RegNum reg_local;
  StackSym *stackSym_local;
  SCCLiveness *this_local;
  
  _end = currentInstr;
  currentInstr_local._7_1_ = reg;
  pSStack_18 = stackSym;
  stackSym_local = (StackSym *)this;
  newLlifetime._0_4_ = IR::Instr::GetNumber(currentInstr);
  pJVar4 = this->tempAlloc;
  newLlifetime._4_4_ = (uint32)newLlifetime;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&Lifetime::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
             ,0x306);
  pJVar4 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar4,&local_60);
  iter.super_EditingIterator.last = (NodeBase *)Memory::JitArenaAllocator::Alloc;
  this_01 = (Lifetime *)new<Memory::JitArenaAllocator>(0xa0,pJVar4,0x4e98c0);
  Lifetime::Lifetime(this_01,this->tempAlloc,pSStack_18,currentInstr_local._7_1_,newLlifetime._4_4_,
                     (uint32)newLlifetime);
  uVar1 = this->totalOpHelperFullVisitedLength;
  local_38 = this_01;
  uVar3 = CurrentOpHelperVisitedLength(this,_end);
  local_38->totalOpHelperLengthByEnd = uVar1 + uVar3;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&lifetime,&this->lifetimeList);
  do {
    bVar2 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)&lifetime);
    if (!bVar2) break;
    ppLVar5 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&lifetime);
  } while (newLlifetime._4_4_ < (*ppLVar5)->start);
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
            ((EditingIterator *)&lifetime,&local_38);
  bVar2 = Func::IsJitInDebugMode(this->func);
  if ((bVar2) && (bVar2 = StackSym::HasByteCodeRegSlot(pSStack_18), bVar2)) {
    this_00 = this->func;
    slotIndex = StackSym::GetByteCodeRegSlot(pSStack_18);
    bVar2 = Func::IsNonTempLocalVar(this_00,slotIndex);
    if (bVar2) {
      *(ushort *)&local_38->field_0x9c = *(ushort *)&local_38->field_0x9c & 0xfff7;
    }
  }
  *(Lifetime **)&(pSStack_18->scratch).globOpt = local_38;
  return local_38;
}

Assistant:

Lifetime *
SCCLiveness::InsertLifetime(StackSym *stackSym, RegNum reg, IR::Instr *const currentInstr)
{
    const uint start = currentInstr->GetNumber(), end = start;
    Lifetime * newLlifetime = JitAnew(tempAlloc, Lifetime, tempAlloc, stackSym, reg, start, end);
    newLlifetime->totalOpHelperLengthByEnd = this->totalOpHelperFullVisitedLength + CurrentOpHelperVisitedLength(currentInstr);

    // Find insertion point
    // This looks like a search, but we should almost exit on the first iteration, except
    // when we have loops and some lifetimes where extended.
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, lifetime, &this->lifetimeList, iter)
    {
        if (lifetime->start <= start)
        {
            break;
        }
    }
    NEXT_SLIST_ENTRY_EDITING;

    iter.InsertBefore(newLlifetime);

    // let's say 'var a = 10;'. if a is not used in the function, we still want to have the instr, otherwise the write-through will not happen and upon debug bailout
    // we would not be able to restore the values to see in locals window.
    if (this->func->IsJitInDebugMode() && stackSym->HasByteCodeRegSlot() && this->func->IsNonTempLocalVar(stackSym->GetByteCodeRegSlot()))
    {
        newLlifetime->isDeadStore = false;
    }

    stackSym->scratch.linearScan.lifetime = newLlifetime;
    return newLlifetime;
}